

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolverTypes.h
# Opt level: O2

void __thiscall
Minisat::
OccLists<Minisat::Lit,_Minisat::vec<Minisat::Solver::Watcher,_int>,_Minisat::Solver::WatcherDeleted,_Minisat::MkIndexLit>
::clean(OccLists<Minisat::Lit,_Minisat::vec<Minisat::Solver::Watcher,_int>,_Minisat::Solver::WatcherDeleted,_Minisat::MkIndexLit>
        *this,Lit *idx)

{
  bool bVar1;
  vec<Minisat::Solver::Watcher,_int> *this_00;
  char *pcVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  
  this_00 = IntMap<Minisat::Lit,_Minisat::vec<Minisat::Solver::Watcher,_int>,_Minisat::MkIndexLit>::
            operator[](&this->occs,(Lit)idx->x);
  lVar4 = 0;
  iVar6 = 0;
  for (lVar5 = 0; lVar5 < this_00->sz; lVar5 = lVar5 + 1) {
    bVar1 = Solver::WatcherDeleted::operator()
                      (&this->deleted,(Watcher *)((long)&this_00->data->cref + lVar4));
    if (!bVar1) {
      lVar3 = (long)iVar6;
      iVar6 = iVar6 + 1;
      this_00->data[lVar3] = this_00->data[lVar5];
    }
    lVar4 = lVar4 + 8;
  }
  vec<Minisat::Solver::Watcher,_int>::shrink(this_00,(int)lVar5 - iVar6);
  pcVar2 = IntMap<Minisat::Lit,_char,_Minisat::MkIndexLit>::operator[](&this->dirty,(Lit)idx->x);
  *pcVar2 = '\0';
  return;
}

Assistant:

void OccLists<K,Vec,Deleted,MkIndex>::clean(const K& idx)
{
    Vec& vec = occs[idx];
    int  i, j;
    for (i = j = 0; i < vec.size(); i++)
        if (!deleted(vec[i]))
            vec[j++] = vec[i];
    vec.shrink(i - j);
    dirty[idx] = 0;
}